

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O3

void __thiscall
t_go_generator::generate_serialize_struct
          (t_go_generator *this,ostream *out,t_struct *tstruct,string *prefix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  string local_48;
  
  t_generator::indent_abi_cxx11_(&local_48,&this->super_t_generator);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"if err := ",10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(this->write_method_name_)._M_dataplus._M_p,
                      (this->write_method_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(ctx, oprot); err != nil {",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_48,&this->super_t_generator);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"  return thrift.PrependError(fmt.Sprintf(\"%T error writing struct: \", ",0x46)
  ;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"), err)",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_48,&this->super_t_generator);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_go_generator::generate_serialize_struct(ostream& out, t_struct* tstruct, string prefix) {
  (void)tstruct;
  out << indent() << "if err := " << prefix << "." << write_method_name_ << "(ctx, oprot); err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(fmt.Sprintf(\"%T error writing struct: \", "
      << prefix << "), err)" << endl;
  out << indent() << "}" << endl;
}